

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenPoseVideo.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *__s;
  undefined1 auVar3 [16];
  Size **ppSVar4;
  char cVar5;
  undefined4 uVar6;
  _InputArray *p_Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  int n;
  ulong uVar11;
  long lVar12;
  int iVar13;
  float fVar14;
  float fVar17;
  double dVar15;
  __m128 t;
  undefined1 auVar16 [16];
  __m128 t_3;
  __m128 t_4;
  undefined1 auVar18 [16];
  __m128 t_2;
  Mat probMap;
  Point maxLoc;
  string videoFile;
  Net net;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> points;
  double prob;
  VideoCapture cap;
  Mat output;
  VideoWriter video;
  Mat inpBlob;
  Mat frame;
  Mat frameCopy;
  _InputArray local_3d8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  _InputArray local_3a8;
  undefined8 uStack_390;
  undefined8 local_348;
  int local_340;
  int local_33c;
  int local_338;
  int local_334;
  int local_330;
  int local_32c;
  int local_328;
  int local_324;
  long *local_320;
  char *local_318;
  long local_310 [2];
  undefined4 local_300 [2];
  Mat *local_2f8;
  undefined8 local_2f0;
  Size *local_2e8;
  _InputArray *p_Stack_2e0;
  undefined1 local_2d8 [32];
  long local_2b8;
  long local_2b0;
  undefined8 local_2a8;
  int local_2a0;
  int iStack_29c;
  double local_298 [2];
  VideoCapture local_288 [48];
  long *local_258;
  undefined8 uStack_250;
  long local_248 [6];
  long local_218;
  long local_210;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  _InputArray local_1c8;
  int local_1a0;
  int local_19c;
  _InputArray local_198 [4];
  _InputArray local_138 [4];
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Mat local_90 [96];
  int iVar19;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"USAGE : ./openpose <VideoFile> ",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
  std::ostream::put('\b');
  std::ostream::flush();
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"sample_video.mp4","");
  if (argc == 2) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_320,0,local_318,(ulong)__s);
  }
  cv::VideoCapture::VideoCapture(local_288,(string *)&local_320,0);
  cVar5 = cv::VideoCapture::isOpened();
  if (cVar5 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to connect to camera",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    iVar8 = 1;
    std::ostream::flush();
  }
  else {
    cv::Mat::Mat((Mat *)local_138);
    cv::Mat::Mat(local_90);
    local_2e8 = (Size *)cv::VideoCapture::get((int)local_288);
    local_3b8 = (double)cv::VideoCapture::get((int)local_288);
    local_198[0]._0_8_ = (long)local_198 + 0x10U;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Output-Skeleton.avi","");
    uVar6 = cv::VideoWriter::fourcc('M','J','P','G');
    iVar8 = (int)(double)local_2e8;
    iVar9 = (int)local_3b8;
    local_1a0 = iVar8;
    local_19c = iVar9;
    cv::VideoWriter::VideoWriter((VideoWriter *)0x4024000000000000,&local_1c8,local_198,uVar6);
    if (local_198[0]._0_8_ != (long)local_198 + 0x10U) {
      operator_delete((void *)local_198[0]._0_8_,(long)local_198[0].sz + 1);
    }
    cv::dnn::dnn4_v20211004::readNetFromCaffe((string *)local_2d8,(string *)&protoFile_abi_cxx11_);
    local_1f8 = CONCAT44((float)iVar9,(float)iVar8);
    uStack_1f0 = 0;
    local_2e8 = (Size *)0x0;
    p_Stack_2e0 = (_InputArray *)0x406fe00000000000;
    while( true ) {
      iVar8 = cv::waitKey(1);
      if (-1 < iVar8) break;
      local_2b0 = cv::getTickCount();
      cv::VideoCapture::operator>>(local_288,(Mat *)local_138);
      cv::Mat::clone();
      cv::Mat::operator=(local_90,(Mat *)local_198);
      cv::Mat::~Mat((Mat *)local_198);
      local_3a8.sz.width = 0;
      local_3a8.sz.height = 0;
      local_3a8.flags = 0x1010000;
      local_3a8.obj = local_138;
      local_3d8._0_8_ = (undefined1 *)0x17000000170;
      local_248[0] = 0;
      local_248[1] = 0;
      local_258 = (long *)0x0;
      uStack_250 = 0;
      cv::dnn::dnn4_v20211004::blobFromImage
                (local_198,0.00392156862745098,(Size_ *)&local_3a8,(Scalar_ *)&local_3d8,
                 SUB81((string *)&local_258,0),false,0);
      local_3d8.sz.width = 0;
      local_3d8.sz.height = 0;
      local_3d8.flags = 0x1010000;
      local_3d8.obj = local_198;
      local_258 = local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"");
      local_3a8.sz.width = 0;
      local_3a8.sz.height = 0;
      uStack_390 = 0;
      local_3a8._0_8_ = (Size *)0x0;
      local_3a8.obj = (void *)0x0;
      cv::dnn::dnn4_v20211004::Net::setInput
                ((_InputArray *)local_2d8,(string *)&local_3d8,1.0,(Scalar_ *)&local_258);
      if (local_258 != local_248) {
        operator_delete(local_258,local_248[0] + 1);
      }
      local_3a8.obj = (void *)0x0;
      local_3a8.sz = (Size)((ulong)local_3a8.sz & 0xffffffffffffff00);
      local_3a8._0_8_ = &local_3a8.sz;
      cv::dnn::dnn4_v20211004::Net::forward((string *)&local_258);
      if ((Size *)local_3a8._0_8_ != &local_3a8.sz) {
        operator_delete((void *)local_3a8._0_8_,(long)local_3a8.sz + 1);
      }
      local_3b8 = *(double *)(local_218 + 8);
      uStack_3b0 = 0;
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)(local_2d8 + 0x10),
                 (long)nPoints,(allocator_type *)&local_3a8);
      if (0 < nPoints) {
        iVar8 = (int)local_3b8;
        iVar9 = local_3b8._4_4_;
        auVar16._8_4_ = (float)(int)uStack_3b0;
        auVar16._12_4_ = (float)uStack_3b0._4_4_;
        auVar16._4_4_ = (float)(int)local_3b8;
        auVar16._0_4_ = (float)local_3b8._4_4_;
        auVar3._8_8_ = uStack_1f0;
        auVar3._0_8_ = local_1f8;
        _local_1e8 = divps(auVar3,auVar16);
        uVar11 = 0;
        do {
          cv::Mat::Mat((Mat *)&local_3a8,iVar8,iVar9,5,
                       (void *)(*(long *)(local_210 + 8) * uVar11 + local_248[0]),0);
          local_348 = 0;
          local_3d8.sz.width = 0;
          local_3d8.sz.height = 0;
          local_3d8.flags = 0x1010000;
          local_3d8.obj = &local_3a8;
          p_Var7 = (_InputArray *)cv::noArray();
          cv::minMaxLoc(&local_3d8,(double *)0x0,local_298,(Point_ *)0x0,(Point_ *)&local_348,p_Var7
                       );
          fVar14 = -1.0;
          fVar17 = -1.0;
          if (0.009999999776482582 < local_298[0]) {
            local_1d8 = (float)(int)local_348 * (float)local_1e8._0_4_;
            fStack_1d4 = (float)(int)((ulong)local_348 >> 0x20) * (float)local_1e8._4_4_;
            fStack_1d0 = fStack_1e0 * 0.0;
            fStack_1cc = fStack_1dc * 0.0;
            local_2f0 = 0;
            local_300[0] = 0x3010000;
            local_2a0 = (int)local_1d8;
            iStack_29c = (int)fStack_1d4;
            local_3b8 = (double)CONCAT44(iStack_29c,local_2a0);
            uStack_3b0 = CONCAT44((int)fStack_1cc,(int)fStack_1d0);
            local_3d8._0_8_ = local_2e8;
            local_3d8.obj = p_Stack_2e0;
            local_3d8.sz.width = 0;
            local_3d8.sz.height = 0x406fe000;
            uStack_3c0 = 0;
            local_2f8 = local_90;
            cv::circle(local_300,&local_2a0,8,&local_3d8,0xffffffff,8,0);
            local_2f0 = 0;
            local_300[0] = 0x3010000;
            local_2f8 = local_90;
            cv::format_abi_cxx11_((char *)&local_3d8,"%d",uVar11 & 0xffffffff);
            local_2a8 = local_3b8;
            local_b8 = 0;
            uStack_b0 = 0;
            local_a8 = 0x406fe00000000000;
            uStack_a0 = 0;
            cv::putText(0x3ff199999999999a,local_300,&local_3d8,&local_2a8,3,&local_b8,2,8,0);
            fVar14 = local_1d8;
            fVar17 = fStack_1d4;
            if ((Size *)local_3d8._0_8_ != &local_3d8.sz) {
              operator_delete((void *)local_3d8._0_8_,(long)local_3d8.sz + 1);
              fVar14 = local_1d8;
              fVar17 = fStack_1d4;
            }
          }
          *(int *)(local_2d8._16_8_ + uVar11 * 8) = (int)ROUND(fVar14);
          *(int *)(local_2d8._16_8_ + 4 + uVar11 * 8) = (int)ROUND(fVar17);
          cv::Mat::~Mat((Mat *)&local_3a8);
          uVar11 = uVar11 + 1;
        } while ((long)uVar11 < (long)nPoints);
      }
      local_3b8 = (double)local_2b0;
      lVar12 = 0;
      do {
        uVar1 = *(undefined8 *)(local_2d8._16_8_ + (long)POSE_PAIRS[lVar12][0] * 8);
        uVar2 = *(undefined8 *)(local_2d8._16_8_ + (long)POSE_PAIRS[lVar12][1] * 8);
        iVar9 = (int)uVar1;
        auVar18._0_4_ = -(uint)(0 < iVar9);
        iVar10 = (int)((ulong)uVar1 >> 0x20);
        auVar18._4_4_ = -(uint)(0 < iVar10);
        iVar13 = (int)uVar2;
        iVar19 = (int)((ulong)uVar2 >> 0x20);
        auVar18._8_4_ = -(uint)(0 < iVar13);
        auVar18._12_4_ = -(uint)(0 < iVar19);
        iVar8 = movmskps(POSE_PAIRS[lVar12][1],auVar18);
        if (iVar8 == 0xf) {
          local_3d8.sz.width = 0;
          local_3d8.sz.height = 0;
          local_3d8.flags = 0x3010000;
          iVar8 = (int)ROUND((float)iVar9);
          iVar9 = (int)ROUND((float)iVar10);
          iVar13 = (int)ROUND((float)iVar13);
          iVar10 = (int)ROUND((float)iVar19);
          local_3a8._0_8_ = local_2e8;
          local_3a8.obj = p_Stack_2e0;
          local_3a8.sz.width = 0;
          local_3a8.sz.height = 0x406fe000;
          uStack_390 = 0;
          local_3d8.obj = local_138;
          local_330 = iVar13;
          local_32c = iVar10;
          local_328 = iVar8;
          local_324 = iVar9;
          cv::line(&local_3d8,&local_328,&local_330,&local_3a8,8,8,0);
          local_3d8.sz.width = 0;
          local_3d8.sz.height = 0;
          local_3d8.flags = 0x3010000;
          local_3d8.obj = local_138;
          local_3a8._0_8_ = (Size *)0x0;
          local_3a8.obj = (void *)0x0;
          local_3a8.sz.width = 0;
          local_3a8.sz.height = 0x406fe000;
          uStack_390 = 0;
          local_338 = iVar8;
          local_334 = iVar9;
          cv::circle(&local_3d8,&local_338,8,&local_3a8,0xffffffff,8,0);
          local_3d8.sz.width = 0;
          local_3d8.sz.height = 0;
          local_3d8.flags = 0x3010000;
          local_3d8.obj = local_138;
          local_3a8._0_8_ = (Size *)0x0;
          local_3a8.obj = (void *)0x0;
          local_3a8.sz.width = 0;
          local_3a8.sz.height = 0x406fe000;
          uStack_390 = 0;
          local_340 = iVar13;
          local_33c = iVar10;
          cv::circle(&local_3d8,&local_340,8,&local_3a8,0xffffffff,8,0);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0xe);
      lVar12 = cv::getTickCount();
      dVar15 = (double)cv::getTickFrequency();
      local_3d8.sz.width = 0;
      local_3d8.sz.height = 0;
      local_3d8.flags = 0x3010000;
      local_3d8.obj = local_138;
      cv::format_abi_cxx11_
                ((char *)&local_3a8,((double)lVar12 - local_3b8) / dVar15,"time taken = %.2f sec");
      local_298[1] = 1.06099789572967e-312;
      local_d8 = 0x406fe00000000000;
      uStack_d0 = 0x4049000000000000;
      local_c8 = 0;
      uStack_c0 = 0;
      ppSVar4 = (Size **)&local_3a8.sz;
      cv::putText(0x3fe999999999999a,&local_3d8,&local_3a8,local_298 + 1,3,&local_d8,2,8,0);
      if ((Size **)local_3a8._0_8_ != ppSVar4) {
        operator_delete((void *)local_3a8._0_8_,(long)local_3a8.sz + 1);
      }
      local_3a8._0_8_ = ppSVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Output-Skeleton","");
      local_3d8.sz.width = 0;
      local_3d8.sz.height = 0;
      local_3d8.flags = 0x1010000;
      local_3d8.obj = local_138;
      cv::imshow((string *)&local_3a8,&local_3d8);
      if ((Size **)local_3a8._0_8_ != ppSVar4) {
        operator_delete((void *)local_3a8._0_8_,(long)local_3a8.sz + 1);
      }
      local_3a8.sz.width = 0;
      local_3a8.sz.height = 0;
      local_3a8.flags = 0x1010000;
      local_3a8.obj = local_138;
      cv::VideoWriter::write(&local_1c8);
      if ((Size)local_2d8._16_8_ != (Size)0x0) {
        operator_delete((void *)local_2d8._16_8_,local_2b8 - local_2d8._16_8_);
      }
      cv::Mat::~Mat((Mat *)&local_258);
      cv::Mat::~Mat((Mat *)local_198);
    }
    cv::VideoCapture::release();
    cv::VideoWriter::release();
    cv::dnn::dnn4_v20211004::Net::~Net((Net *)local_2d8);
    cv::VideoWriter::~VideoWriter((VideoWriter *)&local_1c8);
    cv::Mat::~Mat(local_90);
    cv::Mat::~Mat((Mat *)local_138);
    iVar8 = 0;
  }
  cv::VideoCapture::~VideoCapture(local_288);
  if (local_320 != local_310) {
    operator_delete(local_320,local_310[0] + 1);
  }
  return iVar8;
}

Assistant:

int main(int argc, char **argv)
{

    cout << "USAGE : ./openpose <VideoFile> " << endl;
    
    string videoFile = "sample_video.mp4";
    // Take arguments from commmand line
    if (argc == 2)
    {   
      videoFile = argv[1];
    }

    int inWidth = 368;
    int inHeight = 368;
    float thresh = 0.01;    

    cv::VideoCapture cap(videoFile);

    if (!cap.isOpened())
    {
        cerr << "Unable to connect to camera" << endl;
        return 1;
    }
    
    Mat frame, frameCopy;
    int frameWidth = cap.get(CAP_PROP_FRAME_WIDTH);
    int frameHeight = cap.get(CAP_PROP_FRAME_HEIGHT);
    
    VideoWriter video("Output-Skeleton.avi",VideoWriter::fourcc('M','J','P','G'), 10, Size(frameWidth,frameHeight));

    Net net = readNetFromCaffe(protoFile, weightsFile);
    double t=0;
    while( waitKey(1) < 0)
    {       
        double t = (double) cv::getTickCount();

        cap >> frame;
        frameCopy = frame.clone();
        Mat inpBlob = blobFromImage(frame, 1.0 / 255, Size(inWidth, inHeight), Scalar(0, 0, 0), false, false);

        net.setInput(inpBlob);

        Mat output = net.forward();

        int H = output.size[2];
        int W = output.size[3];

        // find the position of the body parts
        vector<Point> points(nPoints);
        for (int n=0; n < nPoints; n++)
        {
            // Probability map of corresponding body's part.
            Mat probMap(H, W, CV_32F, output.ptr(0,n));

            Point2f p(-1,-1);
            Point maxLoc;
            double prob;
            minMaxLoc(probMap, 0, &prob, 0, &maxLoc);
            if (prob > thresh)
            {
                p = maxLoc;
                p.x *= (float)frameWidth / W ;
                p.y *= (float)frameHeight / H ;

                circle(frameCopy, cv::Point((int)p.x, (int)p.y), 8, Scalar(0,255,255), -1);
                cv::putText(frameCopy, cv::format("%d", n), cv::Point((int)p.x, (int)p.y), cv::FONT_HERSHEY_COMPLEX, 1.1, cv::Scalar(0, 0, 255), 2);
            }
            points[n] = p;
        }

        int nPairs = sizeof(POSE_PAIRS)/sizeof(POSE_PAIRS[0]);

        for (int n = 0; n < nPairs; n++)
        {
            // lookup 2 connected body/hand parts
            Point2f partA = points[POSE_PAIRS[n][0]];
            Point2f partB = points[POSE_PAIRS[n][1]];

            if (partA.x<=0 || partA.y<=0 || partB.x<=0 || partB.y<=0)
                continue;

            line(frame, partA, partB, Scalar(0,255,255), 8);
            circle(frame, partA, 8, Scalar(0,0,255), -1);
            circle(frame, partB, 8, Scalar(0,0,255), -1);
        }

        t = ((double)cv::getTickCount() - t)/cv::getTickFrequency();
        cv::putText(frame, cv::format("time taken = %.2f sec", t), cv::Point(50, 50), cv::FONT_HERSHEY_COMPLEX, .8, cv::Scalar(255, 50, 0), 2);
        // imshow("Output-Keypoints", frameCopy);
        imshow("Output-Skeleton", frame);
        video.write(frame);
    }
    // When everything done, release the video capture and write object
    cap.release();
    video.release();

    return 0;
}